

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::TimeZoneFormat::formatSpecific
          (TimeZoneFormat *this,TimeZone *tz,UTimeZoneNameType stdType,UTimeZoneNameType dstType,
          UDate date,UnicodeString *name,UTimeZoneFormatTimeType *timeType)

{
  TimeZoneNames *pTVar1;
  int iVar2;
  UErrorCode status;
  ConstChar16Ptr local_a8;
  ConstChar16Ptr local_a0;
  UTimeZoneFormatTimeType *local_98;
  UnicodeString local_70;
  
  if (this->fTimeZoneNames != (TimeZoneNames *)0x0) {
    local_98 = timeType;
    iVar2 = (*(tz->super_UObject)._vptr_UObject[10])(tz);
    local_a8.p_ = ZoneMeta::getCanonicalCLDRID(tz);
    if (local_a8.p_ != (UChar *)0x0) {
      pTVar1 = this->fTimeZoneNames;
      if ((char)iVar2 == '\0') {
        icu_63::UnicodeString::UnicodeString(&local_70,'\x01',&local_a8,-1);
        (*(pTVar1->super_UObject)._vptr_UObject[0xc])(date,pTVar1,&local_70,(ulong)stdType,name);
        icu_63::UnicodeString::~UnicodeString(&local_70);
      }
      else {
        local_a0.p_ = local_a8.p_;
        icu_63::UnicodeString::UnicodeString(&local_70,'\x01',&local_a0,-1);
        (*(pTVar1->super_UObject)._vptr_UObject[0xc])(date,pTVar1,&local_70,(ulong)dstType,name);
        icu_63::UnicodeString::~UnicodeString(&local_70);
      }
      if (local_98 == (UTimeZoneFormatTimeType *)0x0) {
        return name;
      }
      if ((ushort)(name->fUnion).fStackFields.fLengthAndFlags < 0x20) {
        return name;
      }
      *local_98 = UTZFMT_TIME_TYPE_DAYLIGHT - ((char)iVar2 == '\0');
      return name;
    }
  }
  icu_63::UnicodeString::setToBogus(name);
  return name;
}

Assistant:

UnicodeString&
TimeZoneFormat::formatSpecific(const TimeZone& tz, UTimeZoneNameType stdType, UTimeZoneNameType dstType,
        UDate date, UnicodeString& name, UTimeZoneFormatTimeType *timeType) const {
    if (fTimeZoneNames == NULL) {
        name.setToBogus();
        return name;
    }

    UErrorCode status = U_ZERO_ERROR;
    UBool isDaylight = tz.inDaylightTime(date, status);
    const UChar* canonicalID = ZoneMeta::getCanonicalCLDRID(tz);

    if (U_FAILURE(status) || canonicalID == NULL) {
        name.setToBogus();
        return name;
    }

    if (isDaylight) {
        fTimeZoneNames->getDisplayName(UnicodeString(TRUE, canonicalID, -1), dstType, date, name);
    } else {
        fTimeZoneNames->getDisplayName(UnicodeString(TRUE, canonicalID, -1), stdType, date, name);
    }

    if (timeType && !name.isEmpty()) {
        *timeType = isDaylight ? UTZFMT_TIME_TYPE_DAYLIGHT : UTZFMT_TIME_TYPE_STANDARD;
    }
    return name;
}